

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O0

void __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::resetAll
          (SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> *this,BumpAllocator *alloc,
          span<const_slang::syntax::TokenOrSyntax,_18446744073709551615UL> children)

{
  int iVar1;
  size_type sVar2;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX;
  undefined1 local_70 [8];
  SmallVector<slang::syntax::TokenOrSyntax,_2UL> buffer;
  BumpAllocator *alloc_local;
  SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> *this_local;
  span<const_slang::syntax::TokenOrSyntax,_18446744073709551615UL> children_local;
  
  children_local.data_ = (pointer)children.size_;
  this_local = (SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> *)children.data_;
  buffer.stackBase._16_8_ = alloc;
  sVar2 = nonstd::span_lite::span<const_slang::syntax::TokenOrSyntax,_18446744073709551615UL>::size
                    ((span<const_slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)&this_local
                    );
  SmallVector<slang::syntax::TokenOrSyntax,_2UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_2UL> *)local_70,sVar2);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::
  append<nonstd::span_lite::span<slang::syntax::TokenOrSyntax_const,18446744073709551615ul>>
            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_70,
             (span<const_slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)&this_local);
  iVar1 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_70,
                     (EVP_PKEY_CTX *)buffer.stackBase._16_8_,src);
  (this->elements).data_ = (pointer)CONCAT44(extraout_var,iVar1);
  (this->elements).size_ = extraout_RDX;
  sVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::size
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_70);
  (this->super_SyntaxListBase).childCount = sVar2;
  SmallVector<slang::syntax::TokenOrSyntax,_2UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_2UL> *)local_70);
  return;
}

Assistant:

void resetAll(BumpAllocator& alloc, span<const TokenOrSyntax> children) final {
        SmallVector<TokenOrSyntax> buffer(children.size(), UninitializedTag());
        buffer.append(children);

        elements = buffer.copy(alloc);
        childCount = buffer.size();
    }